

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false>::
ControlPacket(ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false> *this)

{
  (this->super_ControlPacketSerializableImpl).header = &(this->header).super_FixedHeaderBase;
  (this->super_ControlPacketSerializableImpl).remLength.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00124d58;
  (this->super_ControlPacketSerializableImpl).remLength.size = 1;
  (this->super_ControlPacketSerializableImpl).remLength.field_0.value[0] = '\0';
  (this->super_ControlPacketSerializableImpl).fixedVariableHeader =
       &(this->fixedVariableHeader).super_FixedFieldGeneric;
  (this->super_ControlPacketSerializableImpl).props = &(this->props).super_SerializableProperties;
  (this->super_ControlPacketSerializableImpl).payload = &(this->payload).super_SerializablePayload;
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_001258d0;
  (this->header).super_FixedHeaderBase.typeAndFlags = '\x10';
  (this->header).super_FixedHeaderBase._vptr_FixedHeaderBase = (_func_int **)&PTR_getType_00125940;
  (this->fixedVariableHeader).super_ConnectHeaderImpl.protocolVersion = '\x05';
  (this->fixedVariableHeader).super_ConnectHeaderImpl.field_2 =
       (anon_union_1_8_61e52742_for_ConnectHeaderImpl_2)0x0;
  (this->fixedVariableHeader).super_ConnectHeaderImpl.keepAlive = 0;
  *(undefined4 *)(this->fixedVariableHeader).super_ConnectHeaderImpl.protocolName =
       ConnectHeaderImpl::expectedProtocolName()::protocolName;
  *(undefined2 *)((this->fixedVariableHeader).super_ConnectHeaderImpl.protocolName + 4) =
       DAT_001272c4;
  (this->fixedVariableHeader).super_FixedFieldGeneric.value =
       &(this->fixedVariableHeader)._v.super_GenericTypeBase;
  (this->fixedVariableHeader).super_FixedFieldGeneric.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00125988;
  (this->fixedVariableHeader)._v.super_GenericTypeBase._vptr_GenericTypeBase =
       (_func_int **)&PTR_typeSize_00125a30;
  (this->fixedVariableHeader)._v.value = &(this->fixedVariableHeader).super_ConnectHeaderImpl;
  (this->props).super_SerializableProperties.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00125a70;
  (this->props).length.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_00124d58;
  (this->props).length.size = 1;
  (this->props).length.field_0.value[0] = '\0';
  (this->props).head = (PropertyBase *)0x0;
  (this->props).reference = (PropertyBase *)0x0;
  (this->payload).super_SerializablePayload.super_EmptySerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00125ae0;
  (this->payload).clientID.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_001253d8;
  (this->payload).clientID.length = 0;
  (this->payload).clientID.data = (char *)0x0;
  (this->payload).willMessage = (WillMessage *)0x0;
  (this->payload).username.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_001253d8;
  (this->payload).username.length = 0;
  (this->payload).username.data = (char *)0x0;
  (this->payload).password.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00125498;
  (this->payload).password.length = 0;
  (this->payload).password.data = (uint8 *)0x0;
  (this->payload).fixedHeader = &this->fixedVariableHeader;
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }